

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

int bam_mplp_auto(bam_mplp_t iter,int *_tid,int *_pos,int *n_plp,bam_pileup1_t **plp)

{
  bam_pileup1_t *pbVar1;
  ulong local_58;
  int local_50;
  int local_4c;
  int pos;
  int tid;
  uint64_t new_min;
  int ret;
  int i;
  bam_pileup1_t **plp_local;
  int *n_plp_local;
  int *_pos_local;
  int *_tid_local;
  bam_mplp_t iter_local;
  
  new_min._0_4_ = 0;
  _pos = 0xffffffffffffffff;
  new_min._4_4_ = 0;
  _ret = plp;
  plp_local = (bam_pileup1_t **)n_plp;
  n_plp_local = _pos;
  _pos_local = _tid;
  _tid_local = &iter->n;
  do {
    if (*_tid_local <= new_min._4_4_) {
      *(ulong *)(_tid_local + 2) = _pos;
      if (_pos == 0xffffffffffffffff) {
        iter_local._4_4_ = 0;
      }
      else {
        *_pos_local = (int)(_pos >> 0x20);
        *n_plp_local = (int)_pos;
        for (new_min._4_4_ = 0; new_min._4_4_ < *_tid_local; new_min._4_4_ = new_min._4_4_ + 1) {
          if (*(long *)(*(long *)(_tid_local + 4) + (long)new_min._4_4_ * 8) ==
              *(long *)(_tid_local + 2)) {
            *(undefined4 *)((long)plp_local + (long)new_min._4_4_ * 4) =
                 *(undefined4 *)(*(long *)(_tid_local + 8) + (long)new_min._4_4_ * 4);
            _ret[new_min._4_4_] =
                 *(bam_pileup1_t **)(*(long *)(_tid_local + 10) + (long)new_min._4_4_ * 8);
            new_min._0_4_ = (int)new_min + 1;
          }
          else {
            *(undefined4 *)((long)plp_local + (long)new_min._4_4_ * 4) = 0;
            _ret[new_min._4_4_] = (bam_pileup1_t *)0x0;
          }
        }
        iter_local._4_4_ = (int)new_min;
      }
      return iter_local._4_4_;
    }
    if (*(long *)(*(long *)(_tid_local + 4) + (long)new_min._4_4_ * 8) == *(long *)(_tid_local + 2))
    {
      pbVar1 = bam_plp_auto(*(bam_plp_t *)(*(long *)(_tid_local + 6) + (long)new_min._4_4_ * 8),
                            &local_4c,&local_50,
                            (int *)(*(long *)(_tid_local + 8) + (long)new_min._4_4_ * 4));
      *(bam_pileup1_t **)(*(long *)(_tid_local + 10) + (long)new_min._4_4_ * 8) = pbVar1;
      if (*(int *)(*(long *)(*(long *)(_tid_local + 6) + (long)new_min._4_4_ * 8) + 0x38) != 0) {
        return -1;
      }
      if (*(long *)(*(long *)(_tid_local + 10) + (long)new_min._4_4_ * 8) == 0) {
        local_58 = 0;
      }
      else {
        local_58 = (long)local_4c << 0x20 | (long)local_50;
      }
      *(ulong *)(*(long *)(_tid_local + 4) + (long)new_min._4_4_ * 8) = local_58;
    }
    if ((*(long *)(*(long *)(_tid_local + 10) + (long)new_min._4_4_ * 8) != 0) &&
       (*(ulong *)(*(long *)(_tid_local + 4) + (long)new_min._4_4_ * 8) < _pos)) {
      _pos = *(ulong *)(*(long *)(_tid_local + 4) + (long)new_min._4_4_ * 8);
    }
    new_min._4_4_ = new_min._4_4_ + 1;
  } while( true );
}

Assistant:

int bam_mplp_auto(bam_mplp_t iter, int *_tid, int *_pos, int *n_plp, const bam_pileup1_t **plp)
{
    int i, ret = 0;
    uint64_t new_min = (uint64_t)-1;
    for (i = 0; i < iter->n; ++i) {
        if (iter->pos[i] == iter->min) {
            int tid, pos;
            iter->plp[i] = bam_plp_auto(iter->iter[i], &tid, &pos, &iter->n_plp[i]);
            if ( iter->iter[i]->error ) return -1;
            iter->pos[i] = iter->plp[i] ? (uint64_t)tid<<32 | pos : 0;
        }
        if (iter->plp[i] && iter->pos[i] < new_min) new_min = iter->pos[i];
    }
    iter->min = new_min;
    if (new_min == (uint64_t)-1) return 0;
    *_tid = new_min>>32; *_pos = (uint32_t)new_min;
    for (i = 0; i < iter->n; ++i) {
        if (iter->pos[i] == iter->min) { // FIXME: valgrind reports "uninitialised value(s) at this line"
            n_plp[i] = iter->n_plp[i], plp[i] = iter->plp[i];
            ++ret;
        } else n_plp[i] = 0, plp[i] = 0;
    }
    return ret;
}